

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_5.cpp
# Opt level: O2

int main(void)

{
  istream *this;
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  int temp;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int j_1;
  ulong uVar7;
  int *piVar8;
  int i;
  long lVar9;
  ulong uVar10;
  int j;
  long lVar11;
  int l;
  ulong uVar12;
  int (*paiVar13) [55];
  int *piVar14;
  int m;
  int n;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_3c);
  std::istream::operator>>(this,(int *)&local_40);
  paiVar13 = a;
  for (lVar9 = 0; lVar9 < (int)local_3c; lVar9 = lVar9 + 1) {
    lVar11 = 0;
    piVar8 = *paiVar13;
    for (; lVar11 < (int)local_40; lVar11 = lVar11 + 1) {
      std::istream::operator>>((istream *)&std::cin,piVar8);
      piVar8 = piVar8 + 1;
    }
    paiVar13 = (int (*) [55])((long)paiVar13 + 0xdc);
  }
  uVar2 = 0;
  uVar6 = 0;
  if (0 < (int)local_40) {
    uVar6 = (ulong)local_40;
  }
  local_38 = 0;
  if (0 < (int)local_3c) {
    local_38 = (ulong)local_3c;
  }
  iVar5 = -0x3ed;
  paiVar13 = a;
  for (; uVar7 = uVar2, uVar2 != local_38; uVar2 = uVar2 + 1) {
    for (; uVar7 != local_3c; uVar7 = uVar7 + 1) {
      uVar3 = 0;
      piVar8 = *paiVar13;
      for (; uVar12 = uVar3, uVar3 != uVar6; uVar3 = uVar3 + 1) {
        for (; uVar12 != local_40; uVar12 = uVar12 + 1) {
          iVar4 = 0;
          piVar14 = piVar8;
          for (uVar10 = uVar2; uVar10 <= uVar7; uVar10 = uVar10 + 1) {
            for (lVar9 = 0; uVar3 + lVar9 <= uVar12; lVar9 = lVar9 + 1) {
              iVar4 = iVar4 + piVar14[lVar9];
            }
            piVar14 = piVar14 + 0x37;
          }
          if (iVar5 < iVar4) {
            iVar5 = iVar4;
          }
        }
        piVar8 = piVar8 + 1;
      }
    }
    paiVar13 = (int (*) [55])((long)paiVar13 + 0xdc);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    int n,m,ans;                        //一共有n行，m列，ans用记录和的结果；
    cin >> n >> m;
    ans = -1005;                        //由于最后的结果可能
    for (int i = 0; i < n; ++i) {
        for (int j = 0; j <m; ++j) {
            cin >> a[i][j];
        }
    }
    for(int i = 0; i < n; i++)                                          //以下四个for循环实在暴力遍历找出所有的子矩阵
    {
        for (int j = i;j < n; j++)
        {
            for (int k = 0; k < m; ++k)
            {
                for (int l = k; l < m; ++l)
                {
                    //把子矩阵中所有元素加起来，
                    int temp = 0;   //暂时储存运算结果，来和ans比较，避免零矩阵的情况
                    for (int p = i; p <= j; p++)                        //i代表的是子矩阵行的起点，j代表的是子矩阵行的终点
                    {
                        for(int q = k; q <= l; q++)                     //k代表的是子矩阵列的起点，j代表的是子矩阵列的终点
                        {
                          temp += a[p][q];
                        }
                    }
                    //如果temp比ans的值大，就把结果赋给ans，
                    if(temp > ans)
                        ans = temp;
                }
            }
        }
    }
    cout << ans << endl;
    return 0;

}